

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

TimecodeComponent * __thiscall
ASDCP::MXF::TimecodeComponent::InitFromTLVSet(TimecodeComponent *this,TLVReader *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    StructuralComponent::InitFromTLVSet(&this->super_StructuralComponent,TLVSet);
    if (-1 < *(int *)&(this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket.
                      _vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_TimecodeComponent_RoundedTimecodeBase);
      TLVReader::ReadUi16(&local_80,in_RDX,(ui16_t *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      if (-1 < *(int *)&(this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket.
                        _vptr_KLVPacket) {
        pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                  MDD_TimecodeComponent_StartTimecode);
        TLVReader::ReadUi64(&local_80,in_RDX,(ui64_t *)pMVar1);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        if (-1 < *(int *)&(this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket.
                          _vptr_KLVPacket) {
          pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                    MDD_TimecodeComponent_DropFrame);
          TLVReader::ReadUi8(&local_80,in_RDX,pMVar1->ul);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
        }
      }
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x4ca,
                "virtual ASDCP::Result_t ASDCP::MXF::TimecodeComponent::InitFromTLVSet(TLVReader &)"
               );
}

Assistant:

ASDCP::Result_t
TimecodeComponent::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = StructuralComponent::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi16(OBJ_READ_ARGS(TimecodeComponent, RoundedTimecodeBase));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi64(OBJ_READ_ARGS(TimecodeComponent, StartTimecode));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(TimecodeComponent, DropFrame));
  return result;
}